

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.cc
# Opt level: O3

void * __thiscall cnn::CPUAllocator::malloc(CPUAllocator *this,size_t __size)

{
  int iVar1;
  ulong uVar2;
  ostream *poVar3;
  runtime_error *this_00;
  ulong __alignment;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  uVar2 = (ulong)(this->super_MemAllocator).align;
  if (uVar2 == 1) {
    local_40[0] = (undefined1 *)::malloc(__size);
  }
  else {
    __alignment = 8;
    if (8 < uVar2) {
      __alignment = uVar2;
    }
    if ((uVar2 & uVar2 - 1) != 0) {
      __alignment = uVar2;
    }
    iVar1 = posix_memalign(local_40,__alignment,__size);
    if (iVar1 != 0) goto LAB_00198e50;
  }
  if (local_40[0] != (undefined1 *)0x0) {
    return local_40[0];
  }
LAB_00198e50:
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"CPU memory allocation failed n=",0x1f);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," align=",7);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,(this->super_MemAllocator).align);
  std::endl<char,std::char_traits<char>>(poVar3);
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_40,"CPU memory allocation failed","");
  std::runtime_error::runtime_error(this_00,(string *)local_40);
  *(undefined ***)this_00 = &PTR__runtime_error_002a8638;
  __cxa_throw(this_00,&out_of_memory::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void* CPUAllocator::malloc(size_t n) {
  void* ptr = _mm_malloc(n, align);
  if (!ptr) {
    cerr << "CPU memory allocation failed n=" << n << " align=" << align << endl;
    throw cnn::out_of_memory("CPU memory allocation failed");
  }
  return ptr;
}